

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *
deqp::gles31::Functional::anon_unknown_1::generateReferenceIsolineTessCoords
          (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
           *__return_storage_ptr__,int outer0,int outer1)

{
  Vector<float,_3> local_30;
  int local_24;
  int local_20;
  int x;
  int y;
  int local_14;
  int outer1_local;
  int outer0_local;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *tessCoords;
  
  x._3_1_ = 0;
  y = outer1;
  local_14 = outer0;
  _outer1_local = __return_storage_ptr__;
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (__return_storage_ptr__);
  for (local_20 = 0; local_20 < local_14; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < y + 1; local_24 = local_24 + 1) {
      tcu::Vector<float,_3>::Vector
                (&local_30,(float)local_24 / (float)y,(float)local_20 / (float)local_14,0.0);
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                (__return_storage_ptr__,&local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<Vec3> generateReferenceIsolineTessCoords (int outer0, int outer1)
{
	vector<Vec3> tessCoords;

	for (int y = 0; y < outer0;		y++)
	for (int x = 0; x < outer1+1;	x++)
		tessCoords.push_back(Vec3((float)x / (float)outer1,
												  (float)y / (float)outer0,
												  0.0f));

	return tessCoords;
}